

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem.cpp
# Opt level: O2

void __thiscall Kernel::Problem::addUnits(Problem *this,UnitList *newUnits)

{
  undefined1 *puVar1;
  Unit **ppUVar2;
  List<Kernel::Unit_*> *pLVar3;
  
  pLVar3 = newUnits;
  while (pLVar3 != (UnitList *)0x0) {
    ppUVar2 = &pLVar3->_head;
    pLVar3 = pLVar3->_tail;
    if (((*ppUVar2)->field_0x4 & 1) == 0) {
      puVar1 = &(*ppUVar2)[1]._inference.field_0x8;
      *(int *)puVar1 = *(int *)puVar1 + 1;
    }
  }
  pLVar3 = Lib::List<Kernel::Unit_*>::concat(newUnits,this->_units);
  this->_units = pLVar3;
  if (this->_propertyValid == true) {
    Shell::Property::add(this->_property,newUnits);
    readDetailsFromProperty(this);
    return;
  }
  invalidateEverything(this);
  return;
}

Assistant:

void Problem::addUnits(UnitList* newUnits)
{
  UnitList::Iterator uit(newUnits);
  while(uit.hasNext()) {
    Unit* u = uit.next();
    if(u->isClause()) {
      static_cast<Clause*>(u)->incRefCnt();
    }
  }
  _units = UnitList::concat(newUnits, _units);
  if(_propertyValid) {
    TIME_TRACE(TimeTrace::PROPERTY_EVALUATION);
    _property->add(newUnits);
    readDetailsFromProperty();
  }
  else {
    invalidateEverything();
  }
}